

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O2

bool __thiscall
ON_Geometry::GetTightBoundingBox
          (ON_Geometry *this,ON_BoundingBox *tight_bbox,bool bGrowBoxAsInt,ON_Xform *xform)

{
  bool bVar1;
  undefined7 in_register_00000011;
  bool bGrowBox;
  ON_3dPointArray corners;
  ON_BoundingBox world_bbox;
  
  if ((int)CONCAT71(in_register_00000011,bGrowBoxAsInt) != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBox = true;
    if (bVar1) goto LAB_004ab492;
  }
  ON_BoundingBox::Destroy(tight_bbox);
  bGrowBox = false;
LAB_004ab492:
  if ((xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsIdentity(xform,0.0), !bVar1)) {
    ON_3dPointArray::ON_3dPointArray(&corners,8);
    ON_BoundingBox::ON_BoundingBox(&world_bbox);
    bVar1 = GetBoundingBox(this,&world_bbox,false);
    if (bVar1) {
      ON_BoundingBox::GetCorners(&world_bbox,&corners);
      bVar1 = ON_3dPointArray::GetTightBoundingBox(&corners,tight_bbox,bGrowBox,xform);
      bGrowBox = (bool)(bGrowBox | bVar1);
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&corners.super_ON_SimpleArray<ON_3dPoint>);
    return bGrowBox;
  }
  bVar1 = GetBoundingBox(this,tight_bbox,bGrowBox);
  return (bool)(bVar1 | bGrowBox);
}

Assistant:

bool ON_Geometry::GetTightBoundingBox( 
	ON_BoundingBox& tight_bbox, 
  bool bGrowBoxAsInt,
	const ON_Xform* xform
  ) const
{
  //	This implementation should be overridden by classes derived
  //  from ON_Geometry
  bool bGrowBox = (0!= bGrowBoxAsInt);
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( xform && !xform->IsIdentity() )
  {
    ON_3dPointArray corners(8);
    ON_BoundingBox world_bbox;
    if ( GetBoundingBox(world_bbox,false) )
    {
      world_bbox.GetCorners(corners);
      if ( corners.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        bGrowBox = true;
    }
  }
  else
  {
    if ( GetBoundingBox(tight_bbox,bGrowBox) )
      bGrowBox = true;
  }

  return bGrowBox;
}